

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

Buffer * buffer_create(size_t blksz,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  Buffer *pBVar1;
  
  pBVar1 = (Buffer *)(*m)(0x38,d);
  if (pBVar1 != (Buffer *)0x0) {
    pBVar1->total_bytes = 0;
    pBVar1->head = (BufferBlock *)0x0;
    pBVar1->tail = (BufferBlock *)0x0;
    pBVar1->block_size = blksz;
    pBVar1->m = m;
    pBVar1->f = f;
    pBVar1->d = d;
  }
  return pBVar1;
}

Assistant:

Buffer *buffer_create(size_t blksz, MOJOSHADER_malloc m,
                      MOJOSHADER_free f, void *d)
{
    Buffer *buffer = (Buffer *) m(sizeof (Buffer), d);
    if (buffer != NULL)
    {
        memset(buffer, '\0', sizeof (Buffer));
        buffer->block_size = blksz;
        buffer->m = m;
        buffer->f = f;
        buffer->d = d;
    } // if
    return buffer;
}